

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O3

bool LoadNodes(FileReader *lump)

{
  undefined8 uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  ulong uVar8;
  undefined8 *puVar9;
  node_t *pnVar10;
  undefined8 *puVar11;
  anon_union_32_2_9298864e_for_node_t_4 *paVar12;
  undefined1 *__s;
  uint uVar13;
  undefined8 *puVar14;
  bool bVar15;
  long lVar16;
  bool bVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uStack_40;
  ulong local_38;
  
  if (format5 == '\0') {
    numnodes = (int)((ulong)lump->Length / 0x1c);
    if (numnodes == 0) {
      return false;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)numnodes;
    uVar8 = SUB168(auVar4 * ZEXT816(0x48),0);
    if (SUB168(auVar4 * ZEXT816(0x48),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    uStack_40 = 0x3fc5cb;
    nodes = (node_t *)operator_new__(uVar8);
    local_38 = 0;
    uStack_40 = 0x3fc5eb;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)numnodes;
    uVar8 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x1c),8) == 0) {
      uVar8 = SUB168(auVar5 * ZEXT816(0x1c),0);
    }
    uStack_40 = 0x3fc603;
    puVar9 = (undefined8 *)operator_new__(uVar8);
    uStack_40 = 0x3fc616;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,puVar9,lump->Length);
    lVar18 = (long)numnodes;
    lVar16 = -(lVar18 * 2 + 0xfU & 0xfffffffffffffff0);
    __s = (undefined1 *)((long)&local_38 + lVar16);
    *(undefined8 *)((long)&uStack_40 + lVar16) = 0x3fc63d;
    memset(__s,0,lVar18 * 2);
    if (0 < lVar18) {
      puVar11 = puVar9 + 1;
      paVar12 = &nodes->field_4;
      pnVar10 = nodes;
      puVar14 = puVar9;
      do {
        uVar1 = *puVar14;
        auVar7._10_2_ = (short)((ulong)uVar1 >> 0x20);
        auVar7._0_10_ = (unkuint10)0;
        auVar20._2_12_ =
             SUB1612(ZEXT616(CONCAT42(auVar7._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
        auVar20._0_2_ = (short)uVar1;
        auVar20._14_2_ = 0;
        auVar20 = auVar20 << 0x10;
        pnVar10->x = auVar20._0_4_;
        pnVar10->y = auVar20._4_4_;
        pnVar10->dx = auVar20._8_4_;
        pnVar10->dy = auVar20._12_4_;
        lVar16 = 0;
        bVar17 = true;
        do {
          bVar15 = bVar17;
          uVar2 = *(ushort *)((long)puVar14 + lVar16 * 2 + 0x18);
          uVar13 = (uint)uVar2;
          if ((short)uVar2 < 0) {
            if (numsubsectors <= (int)(uVar13 & 0x7fff)) goto LAB_003fc74c;
            *(ulong *)((long)&pnVar10->field_6 + lVar16 * 8) =
                 (long)&subsectors->sector + (ulong)((uVar13 & 0x7fff) * 0x30) + 1;
          }
          else {
            if ((numnodes <= (int)uVar13) || (*(short *)(__s + (ulong)uVar13 * 2) != 0))
            goto LAB_003fc74c;
            *(ulong *)((long)&pnVar10->field_6 + lVar16 * 8) =
                 (long)&nodes->x + (ulong)(uVar13 * 0x48);
            *(short *)(__s + (ulong)uVar13 * 2) = (short)lVar16 + 1;
          }
          lVar18 = 0;
          do {
            *(float *)((long)paVar12 + lVar18 * 4 + lVar16 * 0x10) =
                 (float)(int)*(short *)((long)puVar11 + lVar18 * 2 + lVar16 * 8);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          lVar16 = 1;
          bVar17 = false;
        } while (bVar15);
        uVar13 = (int)local_38 + 1;
        pnVar10 = pnVar10 + 1;
        puVar14 = (undefined8 *)((long)puVar14 + 0x1c);
        puVar11 = (undefined8 *)((long)puVar11 + 0x1c);
        paVar12 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar12 + 0x48);
        bVar17 = true;
        local_38 = (ulong)uVar13;
      } while ((int)uVar13 < numnodes);
      goto LAB_003fc759;
    }
  }
  else {
    numnodes = (int)((ulong)lump->Length >> 5);
    if (numnodes == 0) {
      return false;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)numnodes;
    uVar8 = SUB168(auVar3 * ZEXT816(0x48),0);
    if (SUB168(auVar3 * ZEXT816(0x48),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    uStack_40 = 0x3fc408;
    nodes = (node_t *)operator_new__(uVar8);
    local_38 = 0;
    uStack_40 = 0x3fc428;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[4])(lump,0,0);
    uVar8 = (long)numnodes << 5;
    if ((long)numnodes < 0) {
      uVar8 = 0xffffffffffffffff;
    }
    uStack_40 = 0x3fc43f;
    puVar9 = (undefined8 *)operator_new__(uVar8);
    uStack_40 = 0x3fc452;
    (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,puVar9,lump->Length);
    lVar18 = (long)numnodes;
    lVar16 = -(lVar18 * 2 + 0xfU & 0xfffffffffffffff0);
    __s = (undefined1 *)((long)&local_38 + lVar16);
    *(undefined8 *)((long)&uStack_40 + lVar16) = 0x3fc479;
    memset(__s,0,lVar18 * 2);
    if (0 < lVar18) {
      puVar11 = puVar9 + 1;
      paVar12 = &nodes->field_4;
      pnVar10 = nodes;
      puVar14 = puVar9;
      do {
        uVar1 = *puVar14;
        auVar6._10_2_ = (short)((ulong)uVar1 >> 0x20);
        auVar6._0_10_ = (unkuint10)0;
        auVar19._2_12_ =
             SUB1612(ZEXT616(CONCAT42(auVar6._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
        auVar19._0_2_ = (short)uVar1;
        auVar19._14_2_ = 0;
        auVar19 = auVar19 << 0x10;
        pnVar10->x = auVar19._0_4_;
        pnVar10->y = auVar19._4_4_;
        pnVar10->dx = auVar19._8_4_;
        pnVar10->dy = auVar19._12_4_;
        lVar16 = 0;
        bVar17 = true;
        do {
          bVar15 = bVar17;
          uVar13 = *(uint *)((long)puVar14 + lVar16 * 4 + 0x18);
          uVar8 = (ulong)uVar13;
          if ((int)uVar13 < 0) {
            if (numsubsectors <= (int)(uVar13 & 0x7fffffff)) goto LAB_003fc74c;
            *(undefined1 **)((long)&pnVar10->field_6 + lVar16 * 8) =
                 (undefined1 *)((long)&subsectors[uVar13 & 0x7fffffff].sector + 1);
          }
          else {
            if ((numnodes <= (int)uVar13) || (*(short *)(__s + uVar8 * 2) != 0)) goto LAB_003fc74c;
            *(node_t **)((long)&pnVar10->field_6 + lVar16 * 8) = nodes + uVar8;
            *(short *)(__s + uVar8 * 2) = (short)lVar16 + 1;
          }
          lVar18 = 0;
          do {
            *(float *)((long)paVar12 + lVar18 * 4 + lVar16 * 0x10) =
                 (float)(int)*(short *)((long)puVar11 + lVar18 * 2 + lVar16 * 8);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          lVar16 = 1;
          bVar17 = false;
        } while (bVar15);
        uVar13 = (int)local_38 + 1;
        pnVar10 = pnVar10 + 1;
        puVar14 = puVar14 + 4;
        puVar11 = puVar11 + 4;
        paVar12 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar12 + 0x48);
        bVar17 = true;
        local_38 = (ulong)uVar13;
      } while ((int)uVar13 < numnodes);
      goto LAB_003fc759;
    }
  }
  bVar17 = true;
  goto LAB_003fc759;
LAB_003fc74c:
  bVar17 = false;
LAB_003fc759:
  *(undefined8 *)(__s + -8) = 0x3fc761;
  operator_delete__(puVar9);
  return bVar17;
}

Assistant:

static bool LoadNodes (FileReader * lump)
{
	const int NF_SUBSECTOR = 0x8000;
	const int GL5_NF_SUBSECTOR = (1 << 31);

	int 		i;
	int 		j;
	int 		k;
	node_t* 	no;
	WORD*		used;

	if (!format5)
	{
		mapnode_t*	mn, * basemn;
		numnodes = lump->GetLength() / sizeof(mapnode_t);

		if (numnodes == 0) return false;

		nodes = new node_t[numnodes];		
		lump->Seek(0, SEEK_SET);

		basemn = mn = new mapnode_t[numnodes];
		lump->Read(mn, lump->GetLength());

		used = (WORD *)alloca (sizeof(WORD)*numnodes);
		memset (used, 0, sizeof(WORD)*numnodes);

		no = nodes;

		for (i = 0; i < numnodes; i++, no++, mn++)
		{
			no->x = LittleShort(mn->x)<<FRACBITS;
			no->y = LittleShort(mn->y)<<FRACBITS;
			no->dx = LittleShort(mn->dx)<<FRACBITS;
			no->dy = LittleShort(mn->dy)<<FRACBITS;
			for (j = 0; j < 2; j++)
			{
				WORD child = LittleShort(mn->children[j]);
				if (child & NF_SUBSECTOR)
				{
					child &= ~NF_SUBSECTOR;
					if (child >= numsubsectors)
					{
						delete [] basemn;
						return false;
					}
					no->children[j] = (BYTE *)&subsectors[child] + 1;
				}
				else if (child >= numnodes)
				{
					delete [] basemn;
					return false;
				}
				else if (used[child])
				{
					delete [] basemn;
					return false;
				}
				else
				{
					no->children[j] = &nodes[child];
					used[child] = j + 1;
				}
				for (k = 0; k < 4; k++)
				{
					no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
				}
			}
		}
		delete [] basemn;
	}
	else
	{
		gl5_mapnode_t*	mn, * basemn;
		numnodes = lump->GetLength() / sizeof(gl5_mapnode_t);

		if (numnodes == 0) return false;

		nodes = new node_t[numnodes];		
		lump->Seek(0, SEEK_SET);

		basemn = mn = new gl5_mapnode_t[numnodes];
		lump->Read(mn, lump->GetLength());

		used = (WORD *)alloca (sizeof(WORD)*numnodes);
		memset (used, 0, sizeof(WORD)*numnodes);

		no = nodes;

		for (i = 0; i < numnodes; i++, no++, mn++)
		{
			no->x = LittleShort(mn->x)<<FRACBITS;
			no->y = LittleShort(mn->y)<<FRACBITS;
			no->dx = LittleShort(mn->dx)<<FRACBITS;
			no->dy = LittleShort(mn->dy)<<FRACBITS;
			for (j = 0; j < 2; j++)
			{
				SDWORD child = LittleLong(mn->children[j]);
				if (child & GL5_NF_SUBSECTOR)
				{
					child &= ~GL5_NF_SUBSECTOR;
					if (child >= numsubsectors)
					{
						delete [] basemn;
						return false;
					}
					no->children[j] = (BYTE *)&subsectors[child] + 1;
				}
				else if (child >= numnodes)
				{
					delete [] basemn;
					return false;
				}
				else if (used[child])
				{
					delete [] basemn;
					return false;
				}
				else
				{
					no->children[j] = &nodes[child];
					used[child] = j + 1;
				}
				for (k = 0; k < 4; k++)
				{
					no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
				}
			}
		}
		delete [] basemn;
	}
	return true;
}